

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

QDockAreaLayoutInfo * __thiscall QDockAreaLayout::info(QDockAreaLayout *this,QList<int> *path)

{
  long originalLength;
  Data *pDVar1;
  CutResult CVar2;
  QDockAreaLayoutInfo *this_00;
  long in_FS_OFFSET;
  QArrayData *d;
  qsizetype l;
  qsizetype p;
  QList<int> local_58;
  qsizetype local_40;
  qsizetype local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  originalLength = (path->d).size;
  this_00 = this->docks + *(path->d).ptr;
  if (originalLength != 1) {
    local_38 = 1;
    local_40 = -1;
    CVar2 = QtPrivate::QContainerImplHelper::mid(originalLength,&local_38,&local_40);
    if (CVar2 < Full) {
      local_58.d.d = (Data *)0x0;
      local_58.d.ptr = (int *)0x0;
      local_58.d.size = 0;
      this_00 = QDockAreaLayoutInfo::info(this_00,&local_58);
    }
    else {
      if (CVar2 == Full) {
        local_58.d.d = (path->d).d;
        local_58.d.ptr = (path->d).ptr;
        local_58.d.size = (path->d).size;
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
          super___atomic_base<int>._M_i =
               (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
      }
      else {
        local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.ptr =
             (int *)QArrayData::allocate((QArrayData **)&local_58,4,0x10,local_40,KeepSize);
        local_58.d.size = local_40;
        pDVar1 = local_58.d.d;
        if (local_40 != 0) {
          memcpy(local_58.d.ptr,(path->d).ptr + local_38,local_40 * 4);
        }
        local_58.d.d = pDVar1;
        if (&pDVar1->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
          LOCK();
          (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar1->super_QArrayData,4,0x10);
          }
        }
      }
      pDVar1 = local_58.d.d;
      this_00 = QDockAreaLayoutInfo::info(this_00,&local_58);
      if (&pDVar1->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,4,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QDockAreaLayoutInfo *QDockAreaLayout::info(const QList<int> &path)
{
    Q_ASSERT(!path.isEmpty());
    const int index = path.first();
    Q_ASSERT(index >= 0 && index < QInternal::DockCount);

    if (path.size() == 1)
        return &docks[index];

    return docks[index].info(path.mid(1));
}